

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_render_size(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  RK_U16 local_2c [2];
  RK_U16 local_28 [2];
  RK_U8 local_24 [4];
  
  RVar1 = mpp_av1_read_unsigned(gb,1,"render_and_frame_size_different",(RK_U32 *)local_24,0,1);
  if (RVar1 < 0) {
    return RVar1;
  }
  current->render_and_frame_size_different = local_24[0];
  if (local_24[0] == '\0') {
    current->render_width_minus_1 = current->frame_width_minus_1;
    current->render_height_minus_1 = current->frame_height_minus_1;
  }
  else {
    RVar1 = mpp_av1_read_unsigned(gb,0x10,"render_width_minus_1",(RK_U32 *)local_28,0,0xffff);
    if (RVar1 < 0) {
      return -1;
    }
    current->render_width_minus_1 = local_28[0];
    RVar1 = mpp_av1_read_unsigned(gb,0x10,"render_height_minus_1",(RK_U32 *)local_2c,0,0xffff);
    if (RVar1 < 0) {
      return -1;
    }
    current->render_height_minus_1 = local_2c[0];
  }
  ctx->render_width = current->render_width_minus_1 + 1;
  ctx->render_height = current->render_height_minus_1 + 1;
  return 0;
}

Assistant:

static RK_S32 mpp_av1_render_size(AV1Context *ctx, BitReadCtx_t *gb,
                                  AV1RawFrameHeader *current)
{
    RK_S32 err;

    flag(render_and_frame_size_different);

    if (current->render_and_frame_size_different) {
        fb(16, render_width_minus_1);
        fb(16, render_height_minus_1);
    } else {
        infer(render_width_minus_1,  current->frame_width_minus_1);
        infer(render_height_minus_1, current->frame_height_minus_1);
    }

    ctx->render_width  = current->render_width_minus_1  + 1;
    ctx->render_height = current->render_height_minus_1 + 1;

    return 0;
}